

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.hpp
# Opt level: O0

void __thiscall
uv::Signal::start(Signal *this,function<void_(int)> *handler,int sigNum,error_code *ec)

{
  _func_void_uv_signal_t_ptr_int *p_Var1;
  error_code eVar2;
  undefined4 uStack_3c;
  _lambda_uv_signal_s__int__1_ local_2d;
  int local_2c;
  error_code *peStack_28;
  int status;
  error_code *ec_local;
  function<void_(int)> *pfStack_18;
  int sigNum_local;
  function<void_(int)> *handler_local;
  Signal *this_local;
  
  peStack_28 = ec;
  ec_local._4_4_ = sigNum;
  pfStack_18 = handler;
  handler_local = (function<void_(int)> *)this;
  std::function<void_(int)>::operator=(&this->startHandler_,handler);
  p_Var1 = start(std::function_const&,int,std::error_code&)::{lambda(uv_signal_s*,int)#1}::
           operator_cast_to_function_pointer(&local_2d);
  local_2c = uv_signal_start(this,p_Var1,ec_local._4_4_);
  if (local_2c != 0) {
    eVar2 = makeErrorCode(local_2c);
    *(ulong *)peStack_28 = CONCAT44(uStack_3c,eVar2._M_value);
    peStack_28->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

inline void Signal::start(const std::function<void(int signum)> &handler, int sigNum, std::error_code &ec)
	{
		startHandler_ = handler;
		auto status = uv_signal_start(&handle_, [](uv_signal_t *handle, int num) {
			auto &signal = *reinterpret_cast<uv::Signal *>(handle->data);
			signal.startHandler_(num);
		}, sigNum);

		if (status != 0) {
			ec = makeErrorCode(status);
		}
	}